

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O3

Vec3fa __thiscall embree::interpolate_linear(embree *this,TutorialData *data,uint primID,float u)

{
  Vec3fa *pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec3fa VVar7;
  
  fVar6 = 1.0 - u;
  pVVar1 = data->hair_vertex_colors + (primID + 1);
  fVar2 = (pVVar1->field_0).m128[2];
  fVar3 = (pVVar1->field_0).m128[3];
  VVar7.field_0._8_4_ = fVar6 * (pVVar1->field_0).m128[0];
  VVar7.field_0._12_4_ = fVar6 * (pVVar1->field_0).m128[1];
  pVVar1 = data->hair_vertex_colors + (primID + 2);
  fVar4 = (pVVar1->field_0).m128[2];
  fVar5 = (pVVar1->field_0).m128[3];
  VVar7.field_0._0_4_ = u * (pVVar1->field_0).m128[0] + VVar7.field_0._8_4_;
  VVar7.field_0._4_4_ = u * (pVVar1->field_0).m128[1] + VVar7.field_0._12_4_;
  *(float *)this = VVar7.field_0._0_4_;
  *(float *)(this + 4) = VVar7.field_0._4_4_;
  *(float *)(this + 8) = u * fVar4 + fVar6 * fVar2;
  *(float *)(this + 0xc) = u * fVar5 + fVar6 * fVar3;
  return (Vec3fa)VVar7.field_0;
}

Assistant:

Vec3fa interpolate_linear(const TutorialData& data, unsigned int primID, float u)
{
  const Vec3fa c0 = ((Vec3fa*) data.hair_vertex_colors)[primID+1];
  const Vec3fa c1 = ((Vec3fa*) data.hair_vertex_colors)[primID+2];
  return Vec3fa(c0*(1.0f-u) + c1*u);
}